

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkDarExtWin(Abc_Ntk_t *pNtk,int nObjId,int nDist,int fVerbose)

{
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  Aig_Man_t *p;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  char *pcVar5;
  int level;
  
  p = Abc_NtkToDar(pNtk,0,1);
  if (p == (Aig_Man_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  if (nObjId == -1) {
    pAVar3 = p;
    pObj = Saig_ManFindPivot(p);
    Abc_Print((int)pAVar3,"Selected object %d as a window pivot.\n",(ulong)(uint)pObj->Id);
LAB_002ae39c:
    pAVar3 = Saig_ManWindowExtract(p,pObj,nDist);
    Aig_ManStop(p);
    if (pAVar3 == (Aig_Man_t *)0x0) {
      pAVar4 = (Abc_Ntk_t *)0x0;
    }
    else {
      pAVar4 = Abc_NtkFromAigPhase(pAVar3);
      pcVar5 = Extra_UtilStrsav(pNtk->pName);
      pAVar4->pName = pcVar5;
      pcVar5 = Extra_UtilStrsav(pNtk->pSpec);
      pAVar4->pSpec = pcVar5;
      Aig_ManStop(pAVar3);
    }
  }
  else {
    pVVar1 = p->vObjs;
    if (pVVar1->nSize <= nObjId) {
      Aig_ManStop(p);
      Abc_Print((int)p,"The ID is too large.\n");
      return (Abc_Ntk_t *)0x0;
    }
    if (pVVar1 == (Vec_Ptr_t *)0x0) {
      pObj = (Aig_Obj_t *)0x0;
    }
    else {
      if (nObjId < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pObj = (Aig_Obj_t *)pVVar1->pArray[(uint)nObjId];
    }
    if (pObj == (Aig_Obj_t *)0x0) {
      Aig_ManStop(p);
      level = (int)p;
      pcVar5 = "Object with ID %d does not exist.\n";
    }
    else {
      uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
      if ((((uVar2 & 7) == 2) && (p->nTruePis <= (pObj->field_0).CioId)) ||
         (0xfffffffd < (uVar2 & 7) - 7)) goto LAB_002ae39c;
      Aig_ManStop(p);
      level = (int)p;
      pcVar5 = "Object with ID %d is not a node or reg output.\n";
    }
    pAVar4 = (Abc_Ntk_t *)0x0;
    Abc_Print(level,pcVar5,(ulong)(uint)nObjId);
  }
  return pAVar4;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarExtWin( Abc_Ntk_t * pNtk, int nObjId, int nDist, int fVerbose )
{
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan1, * pMan;
    Aig_Obj_t * pObj;
    pMan1 = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan1 == NULL )
        return NULL;
    if ( nObjId == -1 )
    {
        pObj = Saig_ManFindPivot( pMan1 );
        Abc_Print( 1, "Selected object %d as a window pivot.\n", pObj->Id );
    }
    else
    {
        if ( nObjId >= Aig_ManObjNumMax(pMan1) )
        {
            Aig_ManStop( pMan1 );
            Abc_Print( 1, "The ID is too large.\n" );
            return NULL;
        }
        pObj = Aig_ManObj( pMan1, nObjId );
        if ( pObj == NULL )
        {
            Aig_ManStop( pMan1 );
            Abc_Print( 1, "Object with ID %d does not exist.\n", nObjId );
            return NULL;
        }
        if ( !Saig_ObjIsLo(pMan1, pObj) && !Aig_ObjIsNode(pObj) )
        {
            Aig_ManStop( pMan1 );
            Abc_Print( 1, "Object with ID %d is not a node or reg output.\n", nObjId );
            return NULL;
        }
    }
    pMan = Saig_ManWindowExtract( pMan1, pObj, nDist );
    Aig_ManStop( pMan1 );
    if ( pMan == NULL )
        return NULL;
    pNtkAig = Abc_NtkFromAigPhase( pMan );
    pNtkAig->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkAig->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    Aig_ManStop( pMan );
    return pNtkAig;
}